

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# python_generator.cc
# Opt level: O2

void __thiscall
google::protobuf::compiler::python::Generator::FixForeignFieldsInNestedExtensions
          (Generator *this,Descriptor *descriptor)

{
  int i;
  long lVar1;
  long lVar2;
  
  lVar2 = 0;
  for (lVar1 = 0; lVar1 < *(int *)(descriptor + 0x48); lVar1 = lVar1 + 1) {
    FixForeignFieldsInNestedExtensions(this,(Descriptor *)(*(long *)(descriptor + 0x50) + lVar2));
    lVar2 = lVar2 + 0xa8;
  }
  lVar2 = 0;
  for (lVar1 = 0; lVar1 < *(int *)(descriptor + 0x78); lVar1 = lVar1 + 1) {
    FixForeignFieldsInExtension(this,(FieldDescriptor *)(*(long *)(descriptor + 0x80) + lVar2));
    lVar2 = lVar2 + 0xa8;
  }
  return;
}

Assistant:

void Generator::FixForeignFieldsInNestedExtensions(
    const Descriptor& descriptor) const {
  // Recursively fix up extensions in all nested types.
  for (int i = 0; i < descriptor.nested_type_count(); ++i) {
    FixForeignFieldsInNestedExtensions(*descriptor.nested_type(i));
  }
  // Fix up extensions directly contained within this type.
  for (int i = 0; i < descriptor.extension_count(); ++i) {
    FixForeignFieldsInExtension(*descriptor.extension(i));
  }
}